

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O0

void __thiscall Test_aistr_append_Test::TestBody(Test_aistr_append_Test *this)

{
  char (*pacVar1) [10];
  bool bVar2;
  char *pcVar3;
  AssertHelper local_120;
  Message local_118;
  int local_110;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  Message local_f0;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  int local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  int local_98;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  int local_70;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  Message local_50 [2];
  invalid_argument *anon_var_0;
  byte local_29;
  char *pcStack_28;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  char buf [10];
  Test_aistr_append_Test *this_local;
  
  memset((void *)((long)&gtest_msg.value + 6),0,10);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffd8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffd8);
  if (bVar2) {
    local_29 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      ai::append<10ul>((char (*) [10])((long)&gtest_msg.value + 6),(char *)0x0);
    }
    if ((local_29 & 1) != 0) goto LAB_00119af5;
    pcStack_28 = 
    "Expected: ai::append(buf, nullptr) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_50);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x6b,pcStack_28);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_50);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
  testing::Message::~Message(local_50);
LAB_00119af5:
  pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
  ai::append<10ul>(pacVar1,"1234");
  local_6c = ai::compare<10ul>(pacVar1,"1234");
  local_70 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_68,"ai::compare(buf, \"1234\")","0",&local_6c,&local_70);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  anon_var_0._0_4_ = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if ((uint)anon_var_0 == 0) {
    pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
    ai::append<10ul>(pacVar1,"");
    local_94 = ai::compare<10ul>(pacVar1,"1234");
    local_98 = 0;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_90,"ai::compare(buf, \"1234\")","0",&local_94,&local_98);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x71,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    anon_var_0._0_4_ = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if ((uint)anon_var_0 == 0) {
      pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
      ai::append<10ul>(pacVar1,"5678");
      local_bc = ai::compare<10ul>(pacVar1,"12345678");
      local_c0 = 0;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_b8,"ai::compare(buf, \"12345678\")","0",&local_bc,
                 &local_c0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar2) {
        testing::Message::Message(&local_c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x74,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_c8);
      }
      anon_var_0._0_4_ = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      if ((uint)anon_var_0 == 0) {
        pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
        ai::append<10ul>(pacVar1,"9");
        local_e4 = ai::compare<10ul>(pacVar1,"123456789");
        local_e8 = 0;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_e0,"ai::compare(buf, \"123456789\")","0",&local_e4,
                   &local_e8);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
        if (!bVar2) {
          testing::Message::Message(&local_f0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                     ,0x77,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_f0);
        }
        anon_var_0._0_4_ = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
        if ((uint)anon_var_0 == 0) {
          pacVar1 = (char (*) [10])((long)&gtest_msg.value + 6);
          ai::append<10ul>(pacVar1,"01");
          local_10c = ai::compare<10ul>(pacVar1,"123456789");
          local_110 = 0;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_108,"ai::compare(buf, \"123456789\")","0",&local_10c,
                     &local_110);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
          if (!bVar2) {
            testing::Message::Message(&local_118);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
            testing::internal::AssertHelper::AssertHelper
                      (&local_120,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x7a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_120,&local_118);
            testing::internal::AssertHelper::~AssertHelper(&local_120);
            testing::Message::~Message(&local_118);
          }
          anon_var_0._0_4_ = (uint)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aistr, append) {
    char buf[10] = {0};

    EXPECT_THROW(ai::append(buf, nullptr), std::invalid_argument);

    ai::append(buf, "1234");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "");
    ASSERT_EQ(ai::compare(buf, "1234"), 0);

    ai::append(buf, "5678");
    ASSERT_EQ(ai::compare(buf, "12345678"), 0);

    ai::append(buf, "9");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);

    ai::append(buf, "01");
    ASSERT_EQ(ai::compare(buf, "123456789"), 0);
}